

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::net::Socket_testFailOpen_Test::TestBody(Socket_testFailOpen_Test *this)

{
  char cVar1;
  int __fd;
  Message *pMVar2;
  Socket socket;
  long *local_30;
  AssertHelper local_28 [8];
  Socket local_20;
  
  jaegertracing::net::Socket::OSResource::OSResource(&local_20._osResource);
  local_20._handle = -1;
  local_20._family = -1;
  local_20._type = -1;
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 != '\0') {
    Socket::open(&local_20,(char *)0xfffffffb,-10);
  }
  testing::Message::Message((Message *)&local_30);
  testing::internal::AssertHelper::AssertHelper
            (local_28,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x1e,
             "Expected: socket.open(-5, -10) throws an exception of type std::system_error.\n  Actual: it throws nothing."
            );
  pMVar2 = (Message *)&local_30;
  testing::internal::AssertHelper::operator=(local_28,pMVar2);
  __fd = (int)pMVar2;
  testing::internal::AssertHelper::~AssertHelper(local_28);
  if (local_30 != (long *)0x0) {
    cVar1 = testing::internal::IsTrue(true);
    if ((cVar1 != '\0') && (local_30 != (long *)0x0)) {
      (**(code **)(*local_30 + 8))();
    }
  }
  Socket::close(&local_20,__fd);
  jaegertracing::net::Socket::OSResource::~OSResource(&local_20._osResource);
  return;
}

Assistant:

TEST(Socket, testFailOpen)
{
    Socket socket;
    ASSERT_THROW(socket.open(-5, -10), std::system_error);
}